

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64map_checked.hh
# Opt level: O1

Roaring64Map * __thiscall
doublechecked::Roaring64Map::operator^=(Roaring64Map *this,Roaring64Map *r)

{
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *this_00;
  _Rb_tree_header *p_Var1;
  ulong uVar2;
  long lVar3;
  const_iterator __position;
  _Rb_tree_const_iterator<unsigned_long> __first;
  _Rb_tree_header *__last;
  
  roaring::Roaring64Map::operator^=(&this->plain,&r->plain);
  this_00 = &this->check;
  __position._M_node = (this->check)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = &(this->check)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)__position._M_node == p_Var1) {
    std::
    _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
    ::operator=(&this_00->_M_t,&(r->check)._M_t);
  }
  else {
    __first._M_node = (r->check)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    __last = &(r->check)._M_t._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)__first._M_node != __last) {
      uVar2 = *(ulong *)(__position._M_node + 1);
      lVar3 = std::_Rb_tree_decrement(&__last->_M_header);
      if ((uVar2 <= *(ulong *)(lVar3 + 0x20)) &&
         (uVar2 = *(ulong *)(__first._M_node + 1),
         lVar3 = std::_Rb_tree_decrement(&p_Var1->_M_header), uVar2 <= *(ulong *)(lVar3 + 0x20))) {
        do {
          while( true ) {
            if ((_Rb_tree_header *)__first._M_node == __last) {
              return this;
            }
            if ((_Rb_tree_header *)__position._M_node != p_Var1) break;
LAB_00112b86:
            std::
            _Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
            ::_M_insert_unique<unsigned_long_const&>
                      ((_Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
                        *)this_00,(unsigned_long *)(__first._M_node + 1));
LAB_00112b8e:
            __first._M_node = (_Base_ptr)std::_Rb_tree_increment(__first._M_node);
          }
          if (*(ulong *)(__position._M_node + 1) == *(ulong *)(__first._M_node + 1)) {
            __position._M_node =
                 (_Base_ptr)
                 std::
                 _Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
                 ::erase_abi_cxx11_((_Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
                                     *)this_00,__position);
            goto LAB_00112b8e;
          }
          if (*(ulong *)(__first._M_node + 1) <= *(ulong *)(__position._M_node + 1))
          goto LAB_00112b86;
          __position._M_node = (_Base_ptr)std::_Rb_tree_increment(__position._M_node);
        } while( true );
      }
      std::
      _Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
      ::_M_insert_range_unique<std::_Rb_tree_const_iterator<unsigned_long>>
                ((_Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
                  *)this_00,__first,(_Rb_tree_const_iterator<unsigned_long>)__last);
    }
  }
  return this;
}

Assistant:

Roaring64Map &operator^=(const Roaring64Map &r) {
        plain ^= r.plain;

        auto it = check.begin();
        auto it_end = check.end();
        auto r_it = r.check.begin();
        auto r_it_end = r.check.end();
        if (it == it_end) {
            check = r.check;
        }  // this empty
        else if (r_it == r_it_end) {
        }  // r empty
        else if (*it > *r.check.rbegin() || *r_it > *check.rbegin()) {
            check.insert(r.check.begin(), r.check.end());  // obvious disjoint
        } else
            while (r_it != r_it_end) {  // may overlap
                if (it == it_end) {
                    check.insert(*r_it);
                    ++r_it;
                } else if (*it == *r_it) {  // remove overlapping value
                    it = check.erase(it);   // returns *following* iterator
                    ++r_it;
                } else if (*it < *r_it) {
                    ++it;
                }  // keep value from this
                else {
                    check.insert(*r_it);
                    ++r_it;
                }  // add value from r
            }

        return *this;
    }